

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void __thiscall Assimp::JSONWriter::EndObj(JSONWriter *this)

{
  PopIndent(this);
  AddIndentation(this);
  this->first = false;
  std::operator<<((ostream *)&this->field_0x58,"}\n");
  return;
}

Assistant:

void EndObj() {
        PopIndent();
        AddIndentation();
        first = false;
        buff << "}\n";
    }